

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_uint16_linear_scaled(void *outputp,int width_times_channels,float *encode)

{
  float *pfVar1;
  float *pfVar2;
  short *psVar3;
  undefined1 auVar4 [12];
  float fVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined1 auVar12 [16];
  float *pfVar13;
  unsigned_short *output;
  short *psVar14;
  short *psVar15;
  short *psVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  auVar12 = _DAT_00195490;
  psVar3 = (short *)((long)outputp + (long)width_times_channels * 2);
  fVar18 = (float)DAT_00195490;
  fVar19 = DAT_00195490._4_4_;
  fVar20 = DAT_00195490._8_4_;
  fVar21 = DAT_00195490._12_4_;
  if (width_times_channels < 8) {
    psVar14 = (short *)outputp;
    if (3 < width_times_channels) {
      do {
        auVar23._0_4_ = *encode * fVar18 + 0.5;
        auVar23._4_4_ = encode[1] * fVar19 + 0.5;
        auVar23._8_4_ = encode[2] * fVar20 + 0.5;
        auVar23._12_4_ = encode[3] * fVar21 + 0.5;
        auVar23 = minps(auVar23,auVar12);
        auVar23 = maxps(auVar23,ZEXT816(0));
        auVar33._0_4_ = (int)auVar23._0_4_ - (int)stbir__s32_32768[0];
        auVar33._4_4_ = (int)auVar23._4_4_ - stbir__s32_32768[0]._4_4_;
        auVar33._8_4_ = (int)auVar23._8_4_ - (int)stbir__s32_32768[1];
        auVar33._12_4_ = (int)auVar23._12_4_ - stbir__s32_32768[1]._4_4_;
        auVar23 = packssdw(auVar33,auVar33);
        *(ulong *)psVar14 =
             CONCAT26(auVar23._6_2_ - stbir__s16_32768[0]._6_2_,
                      CONCAT24(auVar23._4_2_ - stbir__s16_32768[0]._4_2_,
                               CONCAT22(auVar23._2_2_ - stbir__s16_32768[0]._2_2_,
                                        auVar23._0_2_ - (short)stbir__s16_32768[0])));
        encode = encode + 4;
        outputp = psVar14 + 4;
        psVar15 = psVar14 + 8;
        psVar14 = (short *)outputp;
      } while (psVar15 <= psVar3);
    }
    auVar12 = _DAT_00195490;
    if (outputp < psVar3) {
      do {
        auVar4._4_8_ = in_XMM6._8_8_;
        auVar4._0_4_ = 0x3f000000;
        auVar35._0_8_ = auVar4._0_8_ << 0x20;
        auVar35._8_4_ = 0x3f000000;
        auVar35._12_4_ = 0x3f000000;
        auVar36._4_12_ = auVar35._4_12_;
        auVar36._0_4_ = *encode * 65535.0 + 0.5;
        auVar23 = minps(auVar36,auVar12);
        in_XMM6 = maxps(auVar23,ZEXT816(0));
        *(short *)outputp = (short)(int)in_XMM6._0_4_;
        outputp = (void *)((long)outputp + 2);
        encode = encode + 1;
      } while (outputp < psVar3);
    }
  }
  else {
    pfVar13 = encode + (long)width_times_channels + -8;
    psVar14 = psVar3 + -8;
    do {
      pfVar1 = encode + 8;
      psVar15 = (short *)((long)outputp + 0x10);
      psVar16 = psVar14;
      if (psVar15 == psVar3) {
        psVar16 = psVar15;
      }
      fVar5 = *encode;
      pfVar6 = encode + 1;
      pfVar7 = encode + 2;
      pfVar8 = encode + 3;
      pfVar17 = pfVar13;
      if (psVar15 == psVar3) {
        pfVar17 = pfVar1;
      }
      if (psVar15 <= psVar14) {
        psVar16 = psVar15;
      }
      pfVar2 = encode + 4;
      pfVar9 = encode + 5;
      pfVar10 = encode + 6;
      pfVar11 = encode + 7;
      encode = pfVar17;
      if (psVar15 <= psVar14) {
        encode = pfVar1;
      }
      auVar22._0_4_ = fVar5 * fVar18 + 0.5;
      auVar22._4_4_ = *pfVar6 * fVar19 + 0.5;
      auVar22._8_4_ = *pfVar7 * fVar20 + 0.5;
      auVar22._12_4_ = *pfVar8 * fVar21 + 0.5;
      auVar32._0_4_ = *pfVar2 * fVar18 + 0.5;
      auVar32._4_4_ = *pfVar9 * fVar19 + 0.5;
      auVar32._8_4_ = *pfVar10 * fVar20 + 0.5;
      auVar32._12_4_ = *pfVar11 * fVar21 + 0.5;
      auVar23 = minps(auVar22,auVar12);
      auVar23 = maxps(auVar23,ZEXT816(0));
      auVar33 = minps(auVar32,auVar12);
      auVar33 = maxps(auVar33,ZEXT816(0));
      auVar24._0_4_ = (int)auVar23._0_4_ - (int)stbir__s32_32768[0];
      auVar24._4_4_ = (int)auVar23._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar24._8_4_ = (int)auVar23._8_4_ - (int)stbir__s32_32768[1];
      auVar24._12_4_ = (int)auVar23._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar34._0_4_ = (int)auVar33._0_4_ - (int)stbir__s32_32768[0];
      auVar34._4_4_ = (int)auVar33._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar34._8_4_ = (int)auVar33._8_4_ - (int)stbir__s32_32768[1];
      auVar34._12_4_ = (int)auVar33._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar23 = packssdw(auVar24,auVar34);
      sVar25 = auVar23._2_2_ - stbir__s16_32768[0]._2_2_;
      sVar26 = auVar23._4_2_ - stbir__s16_32768[0]._4_2_;
      sVar27 = auVar23._6_2_ - stbir__s16_32768[0]._6_2_;
      sVar28 = auVar23._8_2_ - (short)stbir__s16_32768[1];
      sVar29 = auVar23._10_2_ - stbir__s16_32768[1]._2_2_;
      sVar30 = auVar23._12_2_ - stbir__s16_32768[1]._4_2_;
      sVar31 = auVar23._14_2_ - stbir__s16_32768[1]._6_2_;
      *(short *)outputp = auVar23._0_2_ - (short)stbir__s16_32768[0];
      *(short *)((long)outputp + 2) = sVar25;
      *(short *)((long)outputp + 4) = sVar26;
      *(short *)((long)outputp + 6) = sVar27;
      *(short *)((long)outputp + 8) = sVar28;
      *(short *)((long)outputp + 10) = sVar29;
      *(short *)((long)outputp + 0xc) = sVar30;
      *(short *)((long)outputp + 0xe) = sVar31;
      outputp = psVar16;
    } while (psVar15 != psVar3);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__encode_uint16_linear_scaled)( void * outputp, int width_times_channels, float const * encode )
{
  unsigned short STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned short*) outputp;
  unsigned short * end_output = ( (unsigned short*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  {
    if ( width_times_channels >= stbir__simdfX_float_count*2 )
    {
      float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
      end_output -= stbir__simdfX_float_count*2;
      STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
      for(;;)
      {
        stbir__simdfX e0, e1;
        stbir__simdiX i;
        STBIR_SIMD_NO_UNROLL(encode);
        stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode );
        stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode+stbir__simdfX_float_count );
        stbir__encode_simdfX_unflip( e0 );
        stbir__encode_simdfX_unflip( e1 );
        stbir__simdfX_pack_to_words( i, e0, e1 );
        stbir__simdiX_store( output, i );
        encode += stbir__simdfX_float_count*2;
        output += stbir__simdfX_float_count*2;
        if ( output <= end_output )
          continue;
        if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
          break;
        output = end_output;     // backup and do last couple
        encode = end_encode_m8;
      }
      return;
    }
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e;
    stbir__simdi i;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e, encode );
    stbir__simdf_madd( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), e );
    stbir__encode_simdf4_unflip( e );
    stbir__simdf_pack_to_8words( i, e, e );  // only use first 4
    stbir__simdi_store2( output-4, i );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_short( e );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_short( e );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_short( e );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0-4] = (unsigned short)f;
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1-4] = (unsigned short)f;
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2-4] = (unsigned short)f;
    f = encode[stbir__encode_order3] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[3-4] = (unsigned short)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0] = (unsigned short)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1] = (unsigned short)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2] = (unsigned short)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}